

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_nodeHash(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlChar *local_38;
  xmlNodePtr node1;
  PyObject *py_node1;
  PyObject *args_local;
  PyObject *self_local;
  
  py_node1 = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:nodeHash",&node1);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (node1 == (xmlNodePtr)&_Py_NoneStruct) {
      local_38 = (xmlChar *)0x0;
    }
    else {
      local_38 = node1->name;
    }
    self_local = (PyObject *)PyLong_FromVoidPtr(local_38);
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_nodeHash(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {

    PyObject *py_node1;
    xmlNodePtr node1;

    if (!PyArg_ParseTuple(args, (char *)"O:nodeHash", &py_node1))
	    return NULL;
    /* For simplicity, we use the node pointer address as a hash value */
    node1 = PyxmlNode_Get(py_node1);

    return PyLong_FromVoidPtr(node1);

}